

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcaf_grammar_id(mpc_val_t *x,void *s)

{
  char *pcVar1;
  mpc_parser_t *pmVar2;
  void *pvVar3;
  void *pvVar4;
  mpc_parser_t *p;
  
  pmVar2 = mpca_grammar_find_parser((char *)x,(mpca_grammar_st_t *)s);
  free(x);
  pcVar1 = pmVar2->name;
  pvVar3 = calloc(1,0x38);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)((long)pvVar3 + 0x30) = 0xf;
    *(mpc_parser_t **)((long)pvVar3 + 8) = pmVar2;
  }
  else {
    *(undefined1 *)((long)pvVar3 + 0x30) = 0x10;
    *(mpc_parser_t **)((long)pvVar3 + 8) = pmVar2;
    *(code **)((long)pvVar3 + 0x10) = mpc_ast_add_tag;
    *(char **)((long)pvVar3 + 0x18) = pcVar1;
    pvVar4 = calloc(1,0x38);
    *(undefined1 *)((long)pvVar4 + 0x30) = 0xf;
    *(void **)((long)pvVar4 + 8) = pvVar3;
    pvVar3 = pvVar4;
  }
  *(code **)((long)pvVar3 + 0x10) = mpc_ast_add_root;
  pvVar4 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar4 + 0x30) = 7;
  pmVar2 = mpc_and(2,mpcf_state_ast,pvVar4,pvVar3,free);
  return pmVar2;
}

Assistant:

static mpc_val_t *mpcaf_grammar_id(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpc_parser_t *p = mpca_grammar_find_parser(x, st);
  free(x);

  if (p->name) {
    return mpca_state(mpca_root(mpca_add_tag(p, p->name)));
  } else {
    return mpca_state(mpca_root(p));
  }
}